

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecayedException.h
# Opt level: O3

void __thiscall
libsgp4::DecayedException::DecayedException
          (DecayedException *this,DateTime *dt,Vector *pos,Vector *vel)

{
  double dVar1;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,"Satellite decayed");
  *(undefined ***)this = &PTR__runtime_error_0010dd60;
  (this->_dt).m_encoded = dt->m_encoded;
  (this->_pos).x = 0.0;
  (this->_pos).y = 0.0;
  (this->_pos).z = 0.0;
  (this->_pos).w = 0.0;
  dVar1 = pos->y;
  (this->_pos).x = pos->x;
  (this->_pos).y = dVar1;
  dVar1 = pos->w;
  (this->_pos).z = pos->z;
  (this->_pos).w = dVar1;
  (this->_vel).x = 0.0;
  (this->_vel).y = 0.0;
  (this->_vel).z = 0.0;
  (this->_vel).w = 0.0;
  dVar1 = vel->y;
  (this->_vel).x = vel->x;
  (this->_vel).y = dVar1;
  dVar1 = vel->w;
  (this->_vel).z = vel->z;
  (this->_vel).w = dVar1;
  return;
}

Assistant:

DecayedException(const DateTime& dt, const Vector& pos, const Vector& vel)
        : runtime_error("Satellite decayed")
        , _dt(dt)
        , _pos(pos)
        , _vel(vel)
    {
    }